

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

ALLEGRO_USTR * al_ustr_new_from_utf16(uint16_t *s)

{
  ALLEGRO_USTR *us;
  size_t sVar1;
  long in_RDI;
  size_t n;
  int c;
  ALLEGRO_USTR *ustr;
  uint i;
  int in_stack_ffffffffffffffe4;
  uint local_c;
  
  local_c = 0;
  us = al_ustr_new((char *)0x1f449d);
  while( true ) {
    sVar1 = _al_utf16_get((uint16_t *)(in_RDI + (ulong)local_c * 2),2,
                          (int *)&stack0xffffffffffffffe4);
    if (in_stack_ffffffffffffffe4 == 0) break;
    al_ustr_append_chr(us,in_stack_ffffffffffffffe4);
    local_c = local_c + (int)sVar1;
  }
  return us;
}

Assistant:

ALLEGRO_USTR *al_ustr_new_from_utf16(uint16_t const *s)
{
   unsigned int i = 0;
   ALLEGRO_USTR *ustr = al_ustr_new("");
   while (1) {
      int c;
      /* We expect the passed string to be 0 terminated, so there are
       * always 2 words available.
       */
      size_t n = _al_utf16_get(s + i, 2, &c);
      /* Note: The string already is 0 terminated. */
      if (c == 0)
         break;
      al_ustr_append_chr(ustr, c);
      i += n;
   }
   return ustr;
}